

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O1

void __thiscall sznet::net::TcpConnection::stopReadInLoop(TcpConnection *this)

{
  uint *puVar1;
  EventLoop *this_00;
  Channel *this_01;
  bool bVar2;
  
  this_00 = this->m_loop;
  bVar2 = EventLoop::isInLoopThread(this_00);
  if (!bVar2) {
    EventLoop::abortNotInLoopThread(this_00);
  }
  if ((this->m_reading != false) ||
     ((((this->m_channel)._M_t.
        super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>._M_t.
        super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>.
        super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl)->m_events & 1) != 0)) {
    this_01 = (this->m_channel)._M_t.
              super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>.
              _M_t.
              super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
              .super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl;
    puVar1 = &this_01->m_events;
    *puVar1 = *puVar1 & 0xfffffffe;
    Channel::update(this_01);
    this->m_reading = false;
  }
  return;
}

Assistant:

void TcpConnection::stopReadInLoop()
{
	m_loop->assertInLoopThread();
	if (m_reading || m_channel->isReading())
	{
		m_channel->disableReading();
		m_reading = false;
	}
}